

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O0

double __thiscall ADL_JavaOPL3::Channel2op::getChannelOutput(Channel2op *this,OPL3 *OPL3)

{
  int iVar1;
  double dVar2;
  double feedbackOutput;
  double op2Output;
  double op1Output;
  double channelOutput;
  OPL3 *OPL3_local;
  Channel2op *this_local;
  
  op1Output = 0.0;
  op2Output = 0.0;
  dVar2 = ((this->super_Channel).feedback[0] + (this->super_Channel).feedback[1]) * 0.5;
  iVar1 = (this->super_Channel).cnt;
  if (iVar1 == 0) {
    if ((this->op2->envelopeGenerator).stage == OFF) {
      return 0.0;
    }
    op2Output = Operator::getOperatorOutput(this->op1,OPL3,dVar2);
    op1Output = Operator::getOperatorOutput(this->op2,OPL3,op2Output * 4.0);
  }
  else if (iVar1 == 1) {
    if (((this->op1->envelopeGenerator).stage == OFF) &&
       ((this->op2->envelopeGenerator).stage == OFF)) {
      return 0.0;
    }
    op2Output = Operator::getOperatorOutput(this->op1,OPL3,dVar2);
    dVar2 = Operator::getOperatorOutput(this->op2,OPL3,0.0);
    op1Output = (op2Output + dVar2) / 2.0;
  }
  (this->super_Channel).feedback[0] = (this->super_Channel).feedback[1];
  dVar2 = StripIntPart(op2Output *
                       (double)*(float *)(ChannelData::feedback + (long)(this->super_Channel).fb * 4
                                         ));
  (this->super_Channel).feedback[1] = dVar2;
  return op1Output;
}

Assistant:

double Channel2op::getChannelOutput(OPL3 *OPL3) {
	double channelOutput = 0, op1Output = 0, op2Output = 0;
	// The feedback uses the last two outputs from
	// the first operator, instead of just the last one. 
	double feedbackOutput = (feedback[0] + feedback[1]) / 2;
	
	switch(cnt) {
		// CNT = 0, the operators are in series, with the first in feedback.
		case 0:
			if(op2->envelopeGenerator.stage==EnvelopeGenerator::OFF) 
				return 0;
			op1Output = op1->getOperatorOutput(OPL3, feedbackOutput);
			channelOutput = op2->getOperatorOutput(OPL3, op1Output*toPhase);
			break;
		// CNT = 1, the operators are in parallel, with the first in feedback.
		case 1:
			if(op1->envelopeGenerator.stage==EnvelopeGenerator::OFF && 
				op2->envelopeGenerator.stage==EnvelopeGenerator::OFF) 
					return 0;
			op1Output = op1->getOperatorOutput(OPL3, feedbackOutput);
			op2Output = op2->getOperatorOutput(OPL3, Operator::noModulator);
			channelOutput = (op1Output + op2Output) / 2;
	}
	
	feedback[0] = feedback[1];
	feedback[1] = StripIntPart(op1Output * ChannelData::feedback[fb]);
	return channelOutput;
}